

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_pmeth.c
# Opt level: O0

int pkey_ec_sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  ec_key_st *eckey;
  uchar *in_RCX;
  ulong *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  int in_R8D;
  int sig_sz;
  EC_KEY *ec;
  EC_PKEY_CTX *dctx;
  uint sltmp;
  int type;
  int ret;
  int local_58;
  long lVar2;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_4;
  
  lVar2 = *(long *)(in_RDI + 0x98);
  eckey = EVP_PKEY_get0_EC_KEY((EVP_PKEY *)0x3da0ff);
  iVar1 = ECDSA_size((EC_KEY *)eckey);
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else if (in_RSI == (uchar *)0x0) {
    *in_RDX = (long)iVar1;
    local_4 = 1;
  }
  else if (*in_RDX < (ulong)(long)iVar1) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (int)((ulong)lVar2 >> 0x20),(char *)eckey);
    ERR_set_error(0x10,100,(char *)0x0);
    local_4 = 0;
  }
  else {
    if (*(long *)(lVar2 + 8) == 0) {
      local_58 = 0x40;
    }
    else {
      local_58 = EVP_MD_get_type(*(EVP_MD **)(lVar2 + 8));
    }
    local_4 = ECDSA_sign(local_58,in_RCX,in_R8D,in_RSI,(uint *)&stack0xffffffffffffffc4,
                         (EC_KEY *)eckey);
    if (0 < local_4) {
      *in_RDX = (ulong)in_stack_ffffffffffffffc4;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int pkey_ec_sign(EVP_PKEY_CTX *ctx, unsigned char *sig, size_t *siglen,
                        const unsigned char *tbs, size_t tbslen)
{
    int ret, type;
    unsigned int sltmp;
    EC_PKEY_CTX *dctx = ctx->data;
    /*
     * Discard const. Its marked as const because this may be a cached copy of
     * the "real" key. These calls don't make any modifications that need to
     * be reflected back in the "original" key.
     */
    EC_KEY *ec = (EC_KEY *)EVP_PKEY_get0_EC_KEY(ctx->pkey);
    const int sig_sz = ECDSA_size(ec);

    /* ensure cast to size_t is safe */
    if (!ossl_assert(sig_sz > 0))
        return 0;

    if (sig == NULL) {
        *siglen = (size_t)sig_sz;
        return 1;
    }

    if (*siglen < (size_t)sig_sz) {
        ERR_raise(ERR_LIB_EC, EC_R_BUFFER_TOO_SMALL);
        return 0;
    }

    type = (dctx->md != NULL) ? EVP_MD_get_type(dctx->md) : NID_sha1;

    ret = ECDSA_sign(type, tbs, tbslen, sig, &sltmp, ec);

    if (ret <= 0)
        return ret;
    *siglen = (size_t)sltmp;
    return 1;
}